

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompEqualityExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  bool bVar1;
  uint local_14;
  int op1;
  int eq;
  xmlXPathParserContextPtr ctxt_local;
  
  xmlXPathCompRelationalExpr(ctxt);
  if (ctxt->error == 0) {
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != '=') && (bVar1 = false, *ctxt->cur == '!')) {
        bVar1 = ctxt->cur[1] == '=';
      }
      if (!bVar1) break;
      ch1 = ctxt->comp->last;
      local_14 = (uint)(*ctxt->cur == '=');
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      if ((local_14 == 0) && (*ctxt->cur != '\0')) {
        ctxt->cur = ctxt->cur + 1;
      }
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      xmlXPathCompRelationalExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_EQUAL,local_14,0,0,(void *)0x0,
                          (void *)0x0);
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompEqualityExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompRelationalExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '=') || ((CUR == '!') && (NXT(1) == '='))) {
	int eq;
	int op1 = ctxt->comp->last;

        if (CUR == '=') eq = 1;
	else eq = 0;
	NEXT;
	if (!eq) NEXT;
	SKIP_BLANKS;
        xmlXPathCompRelationalExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_EQUAL, op1, ctxt->comp->last, eq, 0);
	SKIP_BLANKS;
    }
}